

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

void __thiscall QScroller::scrollTo(QScroller *this,QPointF *pos,int scrollTime)

{
  undefined1 auVar1 [16];
  QScrollerPrivate *this_00;
  undefined1 auVar2 [12];
  QDebug this_01;
  bool bVar3;
  char cVar4;
  int iVar5;
  State newstate;
  long in_FS_OFFSET;
  qreal qVar6;
  qreal qVar7;
  qreal v;
  undefined1 auVar8 [16];
  QPointF QVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  QPointF local_b8;
  undefined4 uStack_a8;
  undefined4 local_a4;
  char *local_a0;
  QDebug local_90;
  QPointF local_88;
  QPointF local_78;
  QPointF local_68;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d_ptr;
  if (1 < this_00->state - Pressed) {
    if (this_00->state == Inactive) {
      local_b8.xp._0_4_ = 0;
      local_b8.xp._4_4_ = 0;
      local_b8.yp._0_4_ = 0;
      local_b8.yp._4_4_ = 0;
      bVar3 = QScrollerPrivate::prepareScrolling(this_00,&local_b8);
      if (!bVar3) goto LAB_00653a91;
    }
    auVar1._0_8_ = (this_00->contentPosRange).xp;
    auVar1._8_8_ = (this_00->contentPosRange).yp;
    auVar8._0_8_ = (this_00->contentPosRange).w + (double)auVar1._0_8_;
    auVar8._8_8_ = (this_00->contentPosRange).h + (double)auVar1._8_8_;
    auVar8 = minpd(auVar8,(undefined1  [16])*pos);
    QVar9 = (QPointF)maxpd(auVar8,auVar1);
    local_68 = QVar9;
    qVar6 = QScrollerPrivate::nextSnapPos(this_00,QVar9.xp,0,Horizontal);
    uStack_c4 = QVar9.xp._4_4_;
    uStack_c0 = QVar9.yp._0_4_;
    uStack_bc = QVar9.yp._4_4_;
    auVar2._4_8_ = extraout_XMM0_Qb;
    auVar2._0_4_ = uStack_c4;
    auVar10._0_8_ = auVar2._0_8_ << 0x20;
    auVar10._8_4_ = uStack_c0;
    auVar10._12_4_ = uStack_bc;
    qVar7 = QScrollerPrivate::nextSnapPos(this_00,auVar10._8_8_,0,Vertical);
    cVar4 = qIsNaN(qVar6);
    if (cVar4 == '\0') {
      local_68.xp = qVar6;
    }
    cVar4 = qIsNaN(qVar7);
    if (cVar4 == '\0') {
      local_68.yp = qVar7;
    }
    lcScroller();
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_b8.xp._0_4_ = 2;
      local_b8.xp._4_4_ = 0;
      local_b8.yp._0_4_ = 0;
      local_b8.yp._4_4_ = 0;
      uStack_a8 = 0;
      local_a4 = 0;
      local_a0 = lcScroller::category.name;
      QMessageLogger::debug();
      this_01.stream = local_90.stream;
      QVar11.m_data = (storage_type *)0x18;
      QVar11.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      *(int *)((QTextStream *)local_90.stream + 0x28) =
           *(int *)((QTextStream *)local_90.stream + 0x28) + 1;
      ::operator<<((QDebug)&local_88.yp,&local_88);
      qVar6 = local_88.yp;
      QVar12.m_data = (storage_type *)0xe;
      QVar12.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<((QTextStream *)qVar6,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_88.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_88.yp,' ');
      }
      *(int *)((long)local_88.yp + 0x28) = *(int *)((long)local_88.yp + 0x28) + 1;
      ::operator<<((QDebug)&local_78.yp,&local_78);
      qVar6 = local_78.yp;
      QVar13.m_data = (storage_type *)0x2;
      QVar13.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)qVar6,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.yp,' ');
      }
      QTextStream::operator<<((QTextStream *)local_78.yp,scrollTime);
      if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.yp,' ');
      }
      qVar6 = local_78.yp;
      QVar14.m_data = (storage_type *)0x6;
      QVar14.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<((QTextStream *)qVar6,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_78.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_78.yp,' ');
      }
      QDebug::~QDebug((QDebug *)&local_78.yp);
      QDebug::~QDebug((QDebug *)&local_78);
      QDebug::~QDebug((QDebug *)&local_88.yp);
      QDebug::~QDebug((QDebug *)&local_88);
      QDebug::~QDebug(&local_90);
    }
    local_b8.xp = (this_00->overshootPosition).xp + (this_00->contentPosition).xp;
    local_b8.yp = (this_00->overshootPosition).yp + (this_00->contentPosition).yp;
    bVar3 = qFuzzyCompare(&local_68,&local_b8);
    if (!bVar3) {
      QVar9 = velocity(this);
      iVar5 = 0;
      if (0 < scrollTime) {
        iVar5 = scrollTime;
      }
      QScrollerPrivate::createScrollToSegments
                (this_00,QVar9.xp,(double)iVar5 / 1000.0,local_68.xp,Horizontal,ScrollTypeScrollTo);
      QScrollerPrivate::createScrollToSegments
                (this_00,v,(double)iVar5 / 1000.0,local_68.yp,Vertical,ScrollTypeScrollTo);
      newstate = Scrolling;
      if (scrollTime < 1) {
        QScrollerPrivate::setContentPositionHelperScrolling(this_00);
        newstate = Inactive;
      }
      QScrollerPrivate::setState(this_00,newstate);
    }
  }
LAB_00653a91:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScroller::scrollTo(const QPointF &pos, int scrollTime)
{
    Q_D(QScroller);

    if (d->state == Pressed || d->state == Dragging )
        return;

    // no need to resend a prepare event if we are already scrolling
    if (d->state == Inactive && !d->prepareScrolling(QPointF()))
        return;

    QPointF newpos = clampToRect(pos, d->contentPosRange);
    qreal snapX = d->nextSnapPos(newpos.x(), 0, Qt::Horizontal);
    qreal snapY = d->nextSnapPos(newpos.y(), 0, Qt::Vertical);
    if (!qIsNaN(snapX))
        newpos.setX(snapX);
    if (!qIsNaN(snapY))
        newpos.setY(snapY);

    qCDebug(lcScroller) << "QScroller::scrollTo(req:" << pos << " [pix] / snap:"
                        << newpos << ", " << scrollTime << " [ms])";

    if (newpos == d->contentPosition + d->overshootPosition)
        return;

    QPointF vel = velocity();

    if (scrollTime < 0)
        scrollTime = 0;
    qreal time = qreal(scrollTime) / 1000;

    d->createScrollToSegments(vel.x(), time, newpos.x(), Qt::Horizontal, QScrollerPrivate::ScrollTypeScrollTo);
    d->createScrollToSegments(vel.y(), time, newpos.y(), Qt::Vertical, QScrollerPrivate::ScrollTypeScrollTo);

    if (!scrollTime)
        d->setContentPositionHelperScrolling();
    d->setState(scrollTime ? Scrolling : Inactive);
}